

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

lostFraction __thiscall llvm::detail::IEEEFloat::shiftSignificandRight(IEEEFloat *this,uint bits)

{
  uint uVar1;
  short sVar2;
  short sVar3;
  lostFraction lVar4;
  Significand *dst;
  
  sVar2 = (short)*(undefined4 *)&this->exponent;
  sVar3 = sVar2 + (short)bits;
  if (sVar2 <= sVar3) {
    this->exponent = sVar3;
    uVar1 = this->semantics->precision;
    if (uVar1 - 0x40 < 0xffffff80) {
      dst = (Significand *)(this->significand).parts;
    }
    else {
      dst = &this->significand;
    }
    lVar4 = shiftRight(&dst->part,uVar1 + 0x40 >> 6,bits);
    return lVar4;
  }
  __assert_fail("(ExponentType) (exponent + bits) >= exponent",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x48f,"lostFraction llvm::detail::IEEEFloat::shiftSignificandRight(unsigned int)");
}

Assistant:

lostFraction IEEEFloat::shiftSignificandRight(unsigned int bits) {
  /* Our exponent should not overflow.  */
  assert((ExponentType) (exponent + bits) >= exponent);

  exponent += bits;

  return shiftRight(significandParts(), partCount(), bits);
}